

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dice.cpp
# Opt level: O0

void __thiscall Dice::resolveDuringHand(Dice *this)

{
  undefined4 uVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var5;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var6;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var7;
  mapped_type *pmVar8;
  mapped_type *pmVar9;
  bool local_132;
  undefined1 local_90 [8];
  string answer;
  allocator local_59;
  undefined1 local_58 [8];
  string next;
  undefined1 local_30 [4];
  int keepNumber;
  string keep;
  Dice *this_local;
  
  keep.field_2._8_8_ = this;
  std::__cxx11::string::string((string *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_58,"Y",&local_59);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  iVar3 = getNumbOfRollsRemaining(this);
  if (iVar3 == 0) {
    answer.field_2._8_4_ = 1;
    goto LAB_00107feb;
  }
  iVar3 = getNumbOfRollsRemaining(this);
  if ((iVar3 == 1) && (iVar3 = addToCount(this), iVar3 == 0)) {
    poVar4 = std::operator<<((ostream *)&std::cout,
                             "Selected None on 2nd role, forcing 3rd role and keeping");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    resetResolvedHand(this);
    setResolvedHandToDiceValues(this);
    answer.field_2._8_4_ = 1;
    goto LAB_00107feb;
  }
  iVar3 = getNumbOfRollsRemaining(this);
  if (iVar3 != 2) goto LAB_00107683;
  std::__cxx11::string::string((string *)local_90);
  poVar4 = std::operator<<((ostream *)&std::cout,
                           "Do you want to throw your 1st roll keeps to select more dice on 3rd roll? (Y or N)"
                          );
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::operator>>((istream *)&std::cin,(string *)local_90);
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_90,"Y");
  if (((bVar2) ||
      (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_90,"Yes"), bVar2)) ||
     (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_90,"y"), bVar2)) {
    resetResolvedHand(this);
LAB_00107661:
    answer.field_2._8_4_ = 0;
  }
  else {
    iVar3 = addToCount(this);
    if ((iVar3 != 6) ||
       (((bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_90,"N"), !bVar2 &&
         (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_90,"n"), !bVar2)) &&
        ((bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_90,"NO"), !bVar2 &&
         ((bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_90,"No"), !bVar2 &&
          (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_90,"no"), !bVar2)))))))) goto LAB_00107661;
    answer.field_2._8_4_ = 1;
  }
  std::__cxx11::string::~string((string *)local_90);
  if (answer.field_2._8_4_ == 0) {
LAB_00107683:
    iVar3 = getNumbOfRollsRemaining(this);
    if ((iVar3 == 1) && (iVar3 = addToCount(this), iVar3 == 6)) {
      std::__cxx11::string::operator=((string *)local_58,"N");
    }
    iVar3 = getNumbOfRollsRemaining(this);
    if (iVar3 == 1) {
      showResolvedHand(this);
      poVar4 = std::operator<<((ostream *)&std::cout,
                               "You must select a total of 6 cards to resolve the hand");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    }
LAB_00107737:
    do {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_58,"YES");
      local_132 = true;
      if (!bVar2) {
        local_132 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_58,"Y");
      }
      if (local_132 == false) {
LAB_00107fe4:
        answer.field_2._8_4_ = 0;
        break;
      }
      iVar3 = getNumbOfRollsRemaining(this);
      if (iVar3 != 1) {
        std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
        poVar4 = std::operator<<((ostream *)&std::cout,
                                 "------------------------------------------------------------------"
                                );
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        poVar4 = (ostream *)std::ostream::operator<<(&std::cout,std::left);
        poVar4 = std::operator<<(poVar4,"| ");
        poVar4 = std::operator<<(poVar4,"Which dice do you want to keep?");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        poVar4 = std::operator<<((ostream *)&std::cout,
                                 "------------------------------------------------------------------"
                                );
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        poVar4 = (ostream *)std::ostream::operator<<(&std::cout,std::left);
        poVar4 = std::operator<<(poVar4,"| ");
        poVar4 = std::operator<<(poVar4,"All - Type: All , this will discard roll 2 & 3");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        poVar4 = (ostream *)std::ostream::operator<<(&std::cout,std::left);
        poVar4 = std::operator<<(poVar4,"| ");
        poVar4 = std::operator<<(poVar4,"None - Type: None or N, this will force the next roll");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        poVar4 = (ostream *)std::ostream::operator<<(&std::cout,std::left);
        poVar4 = std::operator<<(poVar4,"| ");
        poVar4 = std::operator<<(poVar4,
                                 "Some - Type first letter of type (Dice Type: Char) Ex= A for Attacks..."
                                );
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        poVar4 = std::operator<<((ostream *)&std::cout,
                                 "------------------------------------------------------------------"
                                );
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      }
      iVar3 = getNumbOfRollsRemaining(this);
      if (iVar3 == 1) {
        poVar4 = std::operator<<((ostream *)&std::cout,
                                 "Rest - Type: Rest , this will take the rest of roll 3 and add it to current resolved"
                                );
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      }
      std::operator>>((istream *)&std::cin,(string *)local_30);
      _Var5._M_current = (char *)std::__cxx11::string::begin();
      _Var6._M_current = (char *)std::__cxx11::string::end();
      _Var7._M_current = (char *)std::__cxx11::string::begin();
      std::
      transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(int)>
                (_Var5,_Var6,_Var7,toupper);
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_30,"All");
      if ((bVar2) ||
         (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_30,"ALL"), bVar2)) {
        iVar3 = getNumbOfRollsRemaining(this);
        if (iVar3 < 2) {
          resetResolvedHand(this);
          setResolvedHandToDiceValues(this);
        }
        else {
          addDiceValuesToResolvedHand(this);
        }
        goto LAB_00107fe4;
      }
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_30,"NONE");
      if (((bVar2) ||
          (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_30,"None"), bVar2)) ||
         (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_30,"N"), bVar2)) {
        std::__cxx11::string::operator=((string *)local_58,"N");
        goto LAB_00107fe4;
      }
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_30,"Rest");
      if ((((!bVar2) &&
           (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_30,"rest"), !bVar2)) &&
          (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_30,"REST"), !bVar2)) ||
         (iVar3 = getNumbOfRollsRemaining(this), iVar3 != 1)) {
        poVar4 = std::operator<<((ostream *)&std::cout,
                                 "How many of the selected dice do you want to keep? Ex= 2 for 2 Attacks  "
                                );
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        std::istream::operator>>((istream *)&std::cin,(int *)(next.field_2._M_local_buf + 0xc));
        pmVar8 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Dice::DiceOptions,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Dice::DiceOptions>_>_>
                 ::operator[](&this->diceMap,(key_type *)local_30);
        pmVar9 = std::
                 map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
                 ::operator[](&this->DiceValues,pmVar8);
        uVar1 = next.field_2._12_4_;
        if (*pmVar9 < (int)next.field_2._12_4_) {
          poVar4 = std::operator<<((ostream *)&std::cout,
                                   "You cannot select more than is currently available");
          std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        }
        else {
          pmVar8 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Dice::DiceOptions,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Dice::DiceOptions>_>_>
                   ::operator[](&this->diceMap,(key_type *)local_30);
          pmVar9 = std::
                   map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
                   ::operator[](&this->resolvedHand,pmVar8);
          *pmVar9 = *pmVar9 + uVar1;
          iVar3 = getNumbOfRollsRemaining(this);
          if ((iVar3 == 1) && (iVar3 = addToCount(this), iVar3 == 6)) {
            std::__cxx11::string::operator=((string *)local_58,"N");
          }
          else {
            poVar4 = std::operator<<((ostream *)&std::cout,
                                     "Do you have another selection for dice you wish to keep? Y=Yes, N=No  "
                                    );
            std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
            std::operator>>((istream *)&std::cin,(string *)local_58);
            _Var5._M_current = (char *)std::__cxx11::string::begin();
            _Var6._M_current = (char *)std::__cxx11::string::end();
            _Var7._M_current = (char *)std::__cxx11::string::begin();
            std::
            transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(int)>
                      (_Var5,_Var6,_Var7,toupper);
            bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_58,"N");
            if ((bVar2) ||
               (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_58,"NO"), bVar2)) goto LAB_00107f3d;
            iVar3 = getNumbOfRollsRemaining(this);
            if ((iVar3 == 1) && (iVar3 = addToCount(this), iVar3 != 6)) {
              showResolvedHand(this);
              poVar4 = std::operator<<((ostream *)&std::cout,
                                       "You must select a total of 6 cards to finish with. Please select more cards"
                                      );
              std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
              std::__cxx11::string::operator=((string *)local_58,"Y");
            }
          }
        }
        goto LAB_00107737;
      }
      addDiceValuesToResolvedHand(this);
      std::__cxx11::string::operator=((string *)local_58,"N");
    } while( true );
  }
LAB_00107feb:
  std::__cxx11::string::~string((string *)local_58);
  std::__cxx11::string::~string((string *)local_30);
  return;
LAB_00107f3d:
  answer.field_2._8_4_ = 1;
  goto LAB_00107feb;
}

Assistant:

void Dice::resolveDuringHand() {
    string keep;
    int keepNumber;
    string next = "Y";

    if (this->getNumbOfRollsRemaining() == 0) {
        return;
    }
    if (this->getNumbOfRollsRemaining() == 1 && addToCount() == 0) {
        cout << "Selected None on 2nd role, forcing 3rd role and keeping" << endl;
        resetResolvedHand();
        setResolvedHandToDiceValues();
        return;
    }
    if (getNumbOfRollsRemaining() == 2) {
        string answer;
        cout << "Do you want to throw your 1st roll keeps to select more dice on 3rd roll? (Y or N)" << endl;
        cin >> answer;
        if (answer == "Y" || answer == "Yes" || answer == "y") {
            resetResolvedHand();
        }
        else if (addToCount()==6 && (answer == "N" || answer == "n" || answer == "NO" || answer == "No" || answer == "no")){
            return;
        }
    }

    if(getNumbOfRollsRemaining() == 1 && addToCount()==6) {
        next = "N";
    }

    if(getNumbOfRollsRemaining() == 1) {
        showResolvedHand();
        cout << "You must select a total of 6 cards to resolve the hand" << endl;
    }

    while (next == "YES" || next == "Y") {
        if(getNumbOfRollsRemaining() != 1) {
            cout << endl;
            cout << "------------------------------------------------------------------" << endl;
            cout << left << "| " << "Which dice do you want to keep?" << endl;
            cout << "------------------------------------------------------------------" << endl;
            cout << left << "| " << "All - Type: All , this will discard roll 2 & 3" << endl;
            cout << left << "| " << "None - Type: None or N, this will force the next roll" << endl;
            cout << left << "| " << "Some - Type first letter of type (Dice Type: Char) Ex= A for Attacks..." << endl;
            cout << "------------------------------------------------------------------" << endl;

        }

        if(getNumbOfRollsRemaining() == 1) {
            cout << "Rest - Type: Rest , this will take the rest of roll 3 and add it to current resolved" << endl;
        }
        cin >> keep;
        transform(keep.begin(), keep.end(), keep.begin(), ::toupper);
        if(keep == "All" || keep == "ALL") {
            if(getNumbOfRollsRemaining() > 1 ) {
                addDiceValuesToResolvedHand();
                break;
            }
            else{
                resetResolvedHand();
                setResolvedHandToDiceValues();
                break;
            }
        }

        if(keep == "NONE" || keep == "None" || keep == "N") {
            next = "N";
            break;
        }
        if ((keep == "Rest" || keep == "rest" || keep == "REST") && getNumbOfRollsRemaining() == 1)  {
            addDiceValuesToResolvedHand();
            next = "N";
            continue;
        }

        else {
            cout << "How many of the selected dice do you want to keep? Ex= 2 for 2 Attacks  " << endl;
            cin >> keepNumber;
            if(DiceValues[diceMap[keep]] < keepNumber)
            {
                cout << "You cannot select more than is currently available" << endl;
                continue;
            }
            resolvedHand[diceMap[keep]] += keepNumber;
            if(getNumbOfRollsRemaining() == 1 && addToCount()==6) {
                next = "N";
                continue;
            }
            cout << "Do you have another selection for dice you wish to keep? Y=Yes, N=No  " << endl;
            cin >> next;
            transform(next.begin(), next.end(), next.begin(), ::toupper);
            if(next == "N" || next == "NO"){
                return;
            }
            if (getNumbOfRollsRemaining() == 1 && addToCount()!=6){
            showResolvedHand();
            cout << "You must select a total of 6 cards to finish with. Please select more cards" << endl;
            next = "Y";
            continue;
            }
        }

    }
}